

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::VectorT<double,3>>
          (BaseKernel *this,FPropHandleT<OpenMesh::VectorT<double,_3>_> *_ph,string *_name)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  BasePropHandleT<OpenMesh::VectorT<double,_3>_> BVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer ppBVar5;
  VectorT<double,_3> local_38;
  
  BVar3 = PropertyContainer::add<OpenMesh::VectorT<double,3>>(&this->fprops_,&local_38,_name);
  (_ph->super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>).super_BaseHandle.idx_ =
       (int)BVar3.super_BaseHandle.idx_;
  iVar4 = (*this->_vptr_BaseKernel[5])(this);
  ppBVar1 = (this->fprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->fprops_).properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar1;
      ppBVar5 = ppBVar5 + 1) {
    pBVar2 = *ppBVar5;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar4));
    }
  }
  return;
}

Assistant:

void add_property( FPropHandleT<T>& _ph, const std::string& _name="<fprop>")
  {
    _ph = FPropHandleT<T>( fprops_.add(T(), _name) );
    fprops_.resize(n_faces());
  }